

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_ldm.c
# Opt level: O2

void ZSTD_ldm_fillHashTable(ldmState_t *ldmState,BYTE *ip,BYTE *iend,ldmParams_t *params)

{
  BYTE *pBVar1;
  byte bVar2;
  byte bVar3;
  U32 UVar4;
  U32 UVar5;
  BYTE *pBVar6;
  XXH64_hash_t XVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  BYTE *pBVar11;
  uint numSplits;
  uint local_7c;
  BYTE *local_78;
  size_t local_70;
  long local_68;
  BYTE *local_60;
  ulong local_58;
  ldmState_t *local_50;
  ldmParams_t *local_48;
  ldmRollingHashState_t hashState;
  
  UVar4 = params->hashLog;
  uVar9 = (ulong)params->minMatchLength;
  UVar5 = params->bucketSizeLog;
  local_60 = (ldmState->window).base;
  local_50 = ldmState;
  local_48 = params;
  ZSTD_ldm_gear_init(&hashState,params);
  pBVar1 = ip + uVar9;
  local_68 = -uVar9;
  local_7c = ~(-1 << ((char)UVar4 - (char)UVar5 & 0x1fU));
  local_78 = iend;
  local_58 = uVar9;
  for (; ip < local_78; ip = ip + local_70) {
    numSplits = 0;
    local_70 = ZSTD_ldm_gear_feed(&hashState,ip,(long)local_78 - (long)ip,ldmState->splitIndices,
                                  &numSplits);
    uVar9 = (ulong)numSplits;
    for (uVar10 = 0; uVar10 < uVar9; uVar10 = uVar10 + 1) {
      pBVar11 = ip + ldmState->splitIndices[uVar10];
      if (pBVar1 <= pBVar11) {
        pBVar11 = pBVar11 + local_68;
        XVar7 = ZSTD_XXH64(pBVar11,local_58,0);
        uVar8 = (ulong)((uint)XVar7 & local_7c);
        bVar2 = (byte)local_48->bucketSizeLog;
        pBVar6 = local_50->bucketOffsets;
        bVar3 = pBVar6[uVar8];
        local_50->hashTable[(uVar8 << (bVar2 & 0x3f)) + (ulong)bVar3] =
             (ldmEntry_t)((ulong)(uint)((int)pBVar11 - (int)local_60) | XVar7 & 0xffffffff00000000);
        pBVar6[uVar8] = ~(byte)(-1 << (bVar2 & 0x1f)) & bVar3 + 1;
      }
    }
  }
  return;
}

Assistant:

void ZSTD_ldm_fillHashTable(
            ldmState_t* ldmState, const BYTE* ip,
            const BYTE* iend, ldmParams_t const* params)
{
    U32 const minMatchLength = params->minMatchLength;
    U32 const hBits = params->hashLog - params->bucketSizeLog;
    BYTE const* const base = ldmState->window.base;
    BYTE const* const istart = ip;
    ldmRollingHashState_t hashState;
    size_t* const splits = ldmState->splitIndices;
    unsigned numSplits;

    DEBUGLOG(5, "ZSTD_ldm_fillHashTable");

    ZSTD_ldm_gear_init(&hashState, params);
    while (ip < iend) {
        size_t hashed;
        unsigned n;

        numSplits = 0;
        hashed = ZSTD_ldm_gear_feed(&hashState, ip, iend - ip, splits, &numSplits);

        for (n = 0; n < numSplits; n++) {
            if (ip + splits[n] >= istart + minMatchLength) {
                BYTE const* const split = ip + splits[n] - minMatchLength;
                U64 const xxhash = XXH64(split, minMatchLength, 0);
                U32 const hash = (U32)(xxhash & (((U32)1 << hBits) - 1));
                ldmEntry_t entry;

                entry.offset = (U32)(split - base);
                entry.checksum = (U32)(xxhash >> 32);
                ZSTD_ldm_insertEntry(ldmState, hash, entry, *params);
            }
        }

        ip += hashed;
    }
}